

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polevl.c
# Opt level: O1

double hcephes_p1evl(double x,double *coef,int N)

{
  long lVar1;
  double dVar2;
  
  dVar2 = *coef + x;
  lVar1 = 1;
  do {
    dVar2 = dVar2 * x + coef[lVar1];
    lVar1 = lVar1 + 1;
  } while (N != (int)lVar1);
  return dVar2;
}

Assistant:

HCEPHES_API double hcephes_p1evl(double x, double coef[], int N) {
    double ans;
    double *p;
    int i;

    p = coef;
    ans = x + *p++;
    i = N - 1;

    do
        ans = ans * x + *p++;
    while (--i);

    return ans;
}